

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

void __thiscall CHeap::growheap(CHeap *this)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  long in_RDI;
  ulong uVar8;
  int i;
  heapelement *newheap;
  HEAPELEMENT *in_stack_ffffffffffffff88;
  HEAPELEMENT *in_stack_ffffffffffffff90;
  ulong *local_58;
  int local_14;
  
  *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) << 1;
  if (20000000 < *(int *)(in_RDI + 0x14)) {
    *(undefined4 *)(in_RDI + 0x14) = 20000000;
  }
  uVar4 = (ulong)*(int *)(in_RDI + 0x14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar8 = uVar5 + 8;
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar8);
  *puVar6 = uVar4;
  puVar6 = puVar6 + 1;
  if (uVar4 != 0) {
    local_58 = puVar6;
    do {
      HEAPELEMENT::HEAPELEMENT((HEAPELEMENT *)0x1adac2);
      local_58 = local_58 + 3;
    } while (local_58 != puVar6 + uVar4 * 3);
  }
  for (local_14 = 0; local_14 <= *(int *)(in_RDI + 0x10); local_14 = local_14 + 1) {
    HEAPELEMENT::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  lVar1 = *(long *)(in_RDI + 8);
  if (lVar1 != 0) {
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar7 = lVar1 + lVar2 * 0x18; lVar1 != lVar7; lVar7 = lVar7 + -0x18) {
      HEAPELEMENT::~HEAPELEMENT((HEAPELEMENT *)0x1adc06);
    }
    operator_delete__((void *)(lVar1 + -8),lVar2 * 0x18 + 8);
  }
  *(ulong **)(in_RDI + 8) = puVar6;
  return;
}

Assistant:

void CHeap::growheap()
{
    heapelement* newheap;
    int i;

    SBPL_PRINTF("growing heap size from %d ", allocated);

    allocated = 2 * allocated;
    if (allocated > HEAPSIZE) allocated = HEAPSIZE;

    SBPL_PRINTF("to %d\n", allocated);

    newheap = new heapelement[allocated];

    for (i = 0; i <= currentsize; ++i)
        newheap[i] = heap[i];

    delete[] heap;

    heap = newheap;
}